

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetNumFailsEtaMaxErrFail(void *cvode_mem,int small_nef)

{
  int in_ESI;
  long in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetNumFailsEtaMaxErrFail",
                   "cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (in_ESI < 0) {
      *(undefined4 *)(in_RDI + 0x350) = 2;
    }
    else {
      *(int *)(in_RDI + 0x350) = in_ESI;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetNumFailsEtaMaxErrFail(void* cvode_mem, int small_nef)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetNumFailsEtaMaxErrFail",
                   MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  /* set allowed value or use default */
  if (small_nef < 0)
    cv_mem->cv_small_nef = SMALL_NEF_DEFAULT;
  else
    cv_mem->cv_small_nef = small_nef;

  return(CV_SUCCESS);
}